

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int EncodeImageInternal(VP8LBitWriter *bw,uint32_t *argb,VP8LHashChain *hash_chain,
                       VP8LBackwardRefs *refs_array,int width,int height,int quality,int low_effort,
                       CrunchConfig *config,int *cache_bits,int histogram_bits_in,
                       size_t init_byte_position,int *hdr_size,int *data_size,WebPPicture *pic,
                       int percent_range,int *percent)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint32_t quality_00;
  uint uVar10;
  void *pvVar11;
  void *pvVar12;
  long lVar13;
  VP8LBitWriter *dst;
  VP8LHistogram *pic_00;
  size_t sVar14;
  long in_RCX;
  VP8LHistogram *in_RDX;
  VP8LBitWriter *in_RDI;
  uint32_t in_R8D;
  uint32_t in_R9D;
  undefined4 in_stack_00000010;
  long in_stack_00000018;
  int *in_stack_00000020;
  uint32_t in_stack_00000028;
  int in_stack_00000030;
  int *in_stack_00000038;
  int *in_stack_00000040;
  VP8LHistogram *in_stack_00000048;
  int in_stack_00000050;
  VP8LHistogram *in_stack_00000058;
  HuffmanTreeCode *codes_1;
  HuffmanTreeCode *codes;
  int max_tokens;
  int histogram_bits;
  int cache_bits_tmp;
  int i_percent_range;
  int i_remaining_percent;
  int i_cache;
  int cache_bits_best;
  CrunchSubConfig *sub_config;
  size_t bw_size_best;
  VP8LHashChain hash_chain_histogram;
  int hdr_size_tmp;
  VP8LBitWriter bw_best;
  VP8LBitWriter bw_init;
  int write_histogram_image;
  int cache_bits_init;
  int sub_configs_idx;
  uint32_t *histogram_argb;
  HuffmanTreeCode *huffman_codes;
  HuffmanTreeToken *tokens;
  HuffmanTree *huff_tree;
  size_t bit_array_size;
  uint32_t histogram_image_size;
  uint32_t i;
  VP8LHistogram *tmp_histo;
  VP8LHistogramSet *histogram_image;
  int percent_start;
  int remaining_percent;
  uint32_t histogram_image_xysize;
  int iVar15;
  VP8LHashChain *in_stack_fffffffffffffe28;
  VP8LHistogram *percent_store;
  uint32_t bits;
  VP8LBitWriter *in_stack_fffffffffffffe30;
  undefined4 uVar16;
  uint64_t in_stack_fffffffffffffe38;
  VP8LHistogram *huffman_code;
  VP8LHistogram *tokens_00;
  VP8LHistogram *in_stack_fffffffffffffe58;
  VP8LHistogram *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe68;
  int in_stack_fffffffffffffe6c;
  VP8LBitWriter *in_stack_fffffffffffffe70;
  long in_stack_fffffffffffffe80;
  uint32_t in_stack_fffffffffffffe88;
  int iVar17;
  VP8LBackwardRefs *in_stack_fffffffffffffe98;
  WebPPicture *in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeac;
  uint32_t in_stack_fffffffffffffeb0;
  int width_00;
  int in_stack_fffffffffffffebc;
  int in_stack_fffffffffffffec0;
  int in_stack_fffffffffffffec4;
  uint32_t *in_stack_fffffffffffffec8;
  WebPPicture *pic_01;
  VP8LHashChain *in_stack_fffffffffffffed8;
  WebPPicture *in_stack_fffffffffffffef0;
  uint32_t in_stack_fffffffffffffef8;
  int *in_stack_ffffffffffffff00;
  uint32_t in_stack_ffffffffffffff30;
  uint32_t in_stack_ffffffffffffff34;
  VP8LBackwardRefs *in_stack_ffffffffffffff38;
  VP8LHashChain *in_stack_ffffffffffffff40;
  uint32_t *in_stack_ffffffffffffff48;
  uint32_t in_stack_ffffffffffffff50;
  uint32_t local_a4;
  void *local_98;
  uint low_effort_00;
  uint local_74;
  WebPPicture *pWVar18;
  uint32_t percent_range_00;
  VP8LBitWriter *pVVar19;
  uint32_t in_stack_ffffffffffffffa0;
  
  uVar1 = VP8LSubSampleSize(in_R8D,in_stack_00000028);
  uVar2 = VP8LSubSampleSize(in_R9D,in_stack_00000028);
  uVar3 = uVar1 * uVar2;
  uVar2 = *(uint32_t *)&in_stack_00000058->literal;
  pvVar11 = WebPSafeMalloc(in_stack_fffffffffffffe38,(size_t)in_stack_fffffffffffffe30);
  local_98 = (void *)0x0;
  pvVar12 = WebPSafeMalloc(in_stack_fffffffffffffe38,(size_t)in_stack_fffffffffffffe30);
  memcpy(&stack0xffffffffffffff20,in_RDI,0x30);
  pic_01 = (WebPPicture *)0xffffffffffffffff;
  memset(&stack0xfffffffffffffed8,0,0x10);
  iVar4 = VP8LBitWriterInit(in_stack_fffffffffffffe30,(size_t)in_stack_fffffffffffffe28);
  uVar16 = (undefined4)((ulong)in_stack_fffffffffffffe30 >> 0x20);
  if (iVar4 == 0) {
    WebPEncodingSetError((WebPPicture *)in_stack_00000048,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  else if (((pvVar11 == (void *)0x0) || (pvVar12 == (void *)0x0)) ||
          (iVar4 = VP8LHashChainInit(in_stack_fffffffffffffe28,0), iVar4 == 0)) {
    WebPEncodingSetError((WebPPicture *)in_stack_00000048,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  else {
    iVar4 = in_stack_00000050 / 5;
    dst = (VP8LBitWriter *)CONCAT44(uVar16,iVar4);
    percent_store = in_stack_00000048;
    pic_00 = in_stack_00000058;
    iVar5 = VP8LHashChainFill(in_stack_fffffffffffffed8,(uint32_t)((ulong)pic_01 >> 0x20),
                              in_stack_fffffffffffffec8,in_stack_fffffffffffffec4,
                              in_stack_fffffffffffffec0,in_stack_fffffffffffffebc,
                              in_stack_fffffffffffffef0,in_stack_fffffffffffffef8,
                              in_stack_ffffffffffffff00);
    if (iVar5 != 0) {
      uVar2 = iVar4 + uVar2;
      if (*in_stack_00000020 == 0) {
        iVar5 = 10;
      }
      else {
        iVar5 = *in_stack_00000020;
      }
      iVar17 = iVar5;
      if (((*(int *)(in_stack_00000018 + 0x18) < 2) && (*(int *)(in_stack_00000018 + 0xc) == 0)) ||
         (iVar6 = VP8LBitWriterClone((VP8LBitWriter *)pic_00,dst), iVar6 != 0)) {
        for (local_a4 = 0; iVar6 = (int)((ulong)dst >> 0x20),
            (int)local_a4 < *(int *)(in_stack_00000018 + 0x18); local_a4 = local_a4 + 1) {
          lVar13 = in_stack_00000018 + 8 + (long)(int)local_a4 * 8;
          iVar7 = (in_stack_00000050 - iVar4) / *(int *)(in_stack_00000018 + 0x18);
          iVar6 = iVar7 / 4;
          iVar7 = iVar7 - iVar6;
          huffman_code = (VP8LHistogram *)&stack0xfffffffffffffec4;
          percent_store = (VP8LHistogram *)CONCAT44((int)((ulong)percent_store >> 0x20),iVar5);
          dst = (VP8LBitWriter *)((ulong)dst & 0xffffffff00000000);
          in_stack_fffffffffffffe58 =
               (VP8LHistogram *)CONCAT44((int)((ulong)in_stack_fffffffffffffe58 >> 0x20),iVar6);
          pic_00 = in_RDX;
          tokens_00 = in_stack_00000048;
          in_stack_fffffffffffffe60 = in_stack_00000058;
          iVar6 = VP8LGetBackwardReferences
                            (in_stack_fffffffffffffe68,(int)((ulong)in_stack_00000058 >> 0x20),
                             (uint32_t *)in_stack_fffffffffffffe58,
                             (int)((ulong)in_stack_00000048 >> 0x20),(int)in_stack_00000048,
                             (int)((ulong)huffman_code >> 0x20),(int)in_stack_fffffffffffffe80,
                             in_stack_fffffffffffffe88,(VP8LHashChain *)CONCAT44(uVar1,iVar17),
                             in_stack_fffffffffffffe98,&in_stack_fffffffffffffea0->use_argb,
                             (WebPPicture *)
                             CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8),
                             in_stack_fffffffffffffeb0,(int *)CONCAT44(iVar7,iVar6));
          if (iVar6 == 0) goto LAB_00187a79;
          iVar6 = 0;
          while( true ) {
            uVar16 = (undefined4)((ulong)tokens_00 >> 0x20);
            iVar9 = 1;
            if (*(int *)(lVar13 + 4) != 0) {
              iVar9 = 2;
            }
            if (iVar9 <= iVar6) break;
            iVar9 = in_stack_fffffffffffffec4;
            if (iVar6 != 0) {
              iVar9 = 0;
            }
            in_stack_fffffffffffffeb0 = in_stack_00000028;
            if ((iVar6 == 1) && (in_stack_fffffffffffffec4 == 0)) break;
            width_00 = iVar9;
            VP8LBitWriterReset((VP8LBitWriter *)&stack0xffffffffffffff20,in_RDI);
            bits = (uint32_t)((ulong)percent_store >> 0x20);
            iVar15 = (int)((ulong)pic_00 >> 0x20);
            dst = (VP8LBitWriter *)
                  VP8LAllocateHistogramSet((int)((ulong)huffman_code >> 0x20),(int)huffman_code);
            pic_00 = VP8LAllocateHistogram(iVar15);
            if ((dst == (VP8LBitWriter *)0x0) || (pic_00 == (VP8LHistogram *)0x0)) {
              WebPEncodingSetError((WebPPicture *)in_stack_00000048,VP8_ENC_ERROR_OUT_OF_MEMORY);
              goto LAB_00187a79;
            }
            iVar8 = iVar7 / 3;
            iVar7 = iVar7 - iVar8;
            tokens_00 = (VP8LHistogram *)CONCAT44(uVar16,iVar8);
            huffman_code = in_stack_00000048;
            in_stack_fffffffffffffe58 = in_stack_00000058;
            pVVar19 = dst;
            iVar15 = width_00;
            iVar9 = VP8LGetHistoImageSymbols
                              ((int)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                               (int)in_stack_fffffffffffffe70,
                               (VP8LBackwardRefs *)
                               CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68),
                               (int)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                               (int)in_stack_fffffffffffffe60,
                               (int)((ulong)in_stack_00000058 >> 0x20),
                               (int)in_stack_fffffffffffffe80,
                               (VP8LHistogramSet *)CONCAT44(iVar9,in_stack_fffffffffffffe88),
                               (VP8LHistogram *)CONCAT44(uVar1,iVar17),
                               (uint32_t *)in_stack_fffffffffffffe98,in_stack_fffffffffffffea0,
                               in_stack_fffffffffffffea8,
                               (int *)CONCAT44(width_00,in_stack_fffffffffffffeb0));
            if (iVar9 == 0) goto LAB_00187a79;
            quality_00 = (int)pVVar19->bits * 5;
            local_98 = WebPSafeCalloc((uint64_t)pic_00,(size_t)dst);
            if ((local_98 == (void *)0x0) ||
               (iVar9 = GetHuffBitLengthsAndCodes
                                  ((VP8LHistogramSet *)CONCAT44(width_00,in_stack_fffffffffffffeb0),
                                   (HuffmanTreeCode *)
                                   CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)),
               iVar9 == 0)) {
              WebPEncodingSetError((WebPPicture *)in_stack_00000048,VP8_ENC_ERROR_OUT_OF_MEMORY);
              goto LAB_00187a79;
            }
            VP8LFreeHistogramSet((VP8LHistogramSet *)0x187517);
            percent_range_00 = 0;
            VP8LFreeHistogram((VP8LHistogram *)0x187530);
            pWVar18 = (WebPPicture *)0x0;
            if (width_00 < 1) {
              VP8LPutBits(dst,bits,iVar15);
            }
            else {
              VP8LPutBits(dst,bits,iVar15);
              VP8LPutBits(dst,bits,iVar15);
            }
            low_effort_00 = 0;
            for (local_74 = 0; local_74 < uVar3; local_74 = local_74 + 1) {
              if (low_effort_00 <= *(uint *)((long)pvVar12 + (ulong)local_74 * 4)) {
                low_effort_00 = *(int *)((long)pvVar12 + (ulong)local_74 * 4) + 1;
              }
              *(int *)((long)pvVar12 + (ulong)local_74 * 4) =
                   *(int *)((long)pvVar12 + (ulong)local_74 * 4) << 8;
            }
            uVar10 = (uint)(1 < low_effort_00);
            VP8LPutBits(dst,bits,iVar15);
            if (uVar10 != 0) {
              VP8LOptimizeSampling
                        ((uint32_t *)in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                         in_stack_fffffffffffffe68,(int)((ulong)in_stack_fffffffffffffe60 >> 0x20),
                         (int)in_stack_fffffffffffffe60,(int *)in_stack_fffffffffffffe58);
              VP8LPutBits(dst,bits,iVar15);
              uVar16 = (undefined4)((ulong)dst >> 0x20);
              iVar8 = iVar7 / 2;
              iVar7 = iVar7 - iVar8;
              in_stack_fffffffffffffe80 = in_RCX + 0x50;
              in_stack_fffffffffffffe70 = in_RDI;
              in_stack_fffffffffffffe88 = VP8LSubSampleSize(in_R8D,in_stack_fffffffffffffeb0);
              VP8LSubSampleSize(in_R9D,in_stack_fffffffffffffeb0);
              dst = (VP8LBitWriter *)CONCAT44(uVar16,in_stack_00000010);
              pic_00 = in_stack_00000048;
              huffman_code = in_stack_00000058;
              iVar9 = EncodeImageNoHuffman
                                ((VP8LBitWriter *)CONCAT44(uVar10,in_stack_ffffffffffffff50),
                                 in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                                 in_stack_ffffffffffffff38,in_stack_ffffffffffffff34,
                                 in_stack_ffffffffffffff30,quality_00,low_effort_00,pWVar18,
                                 percent_range_00,(int *)CONCAT44(uVar2,in_stack_ffffffffffffffa0));
              if (iVar9 == 0) goto LAB_00187a79;
            }
            in_stack_fffffffffffffeac = 0;
            for (local_74 = 0; local_74 < low_effort_00 * 5; local_74 = local_74 + 1) {
              in_stack_fffffffffffffea0 = (WebPPicture *)((long)local_98 + (ulong)local_74 * 0x18);
              if (in_stack_fffffffffffffeac < in_stack_fffffffffffffea0->use_argb) {
                in_stack_fffffffffffffeac = in_stack_fffffffffffffea0->use_argb;
              }
            }
            pvVar11 = WebPSafeMalloc((uint64_t)pic_00,(size_t)dst);
            if (pvVar11 == (void *)0x0) {
              WebPEncodingSetError((WebPPicture *)in_stack_00000048,VP8_ENC_ERROR_OUT_OF_MEMORY);
              goto LAB_00187a79;
            }
            for (local_74 = 0; local_74 < low_effort_00 * 5; local_74 = local_74 + 1) {
              in_stack_fffffffffffffe98 =
                   (VP8LBackwardRefs *)((long)local_98 + (ulong)local_74 * 0x18);
              StoreHuffmanCode((VP8LBitWriter *)in_stack_fffffffffffffe60,
                               (HuffmanTree *)in_stack_fffffffffffffe58,
                               (HuffmanTreeToken *)tokens_00,(HuffmanTreeCode *)huffman_code);
              ClearHuffmanTreeIfOnlyOneSymbol((HuffmanTreeCode *)in_stack_fffffffffffffe98);
            }
            sVar14 = VP8LBitWriterNumBytes(in_RDI);
            percent_store = in_stack_00000048;
            iVar9 = StoreImageToBitMask((VP8LBitWriter *)CONCAT44(iVar7,iVar8),width_00,
                                        in_stack_fffffffffffffeb0,
                                        (VP8LBackwardRefs *)
                                        CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8
                                                ),(uint32_t *)in_stack_fffffffffffffea0,
                                        (HuffmanTreeCode *)in_stack_fffffffffffffe98,pic_01);
            if (iVar9 == 0) goto LAB_00187a79;
            pWVar18 = (WebPPicture *)VP8LBitWriterNumBytes(in_RDI);
            if (pWVar18 < pic_01) {
              pic_01 = (WebPPicture *)VP8LBitWriterNumBytes(in_RDI);
              *in_stack_00000020 = width_00;
              *in_stack_00000038 = (int)sVar14 - in_stack_00000030;
              sVar14 = VP8LBitWriterNumBytes(in_RDI);
              *in_stack_00000040 = ((int)sVar14 - in_stack_00000030) - *in_stack_00000038;
              VP8LBitWriterSwap((VP8LBitWriter *)in_stack_fffffffffffffe60,
                                (VP8LBitWriter *)in_stack_fffffffffffffe58);
            }
            WebPSafeFree((void *)0x1879c7);
            if (local_98 != (void *)0x0) {
              WebPSafeFree((void *)0x1879ef);
              WebPSafeFree((void *)0x1879fc);
              local_98 = (void *)0x0;
            }
            iVar6 = iVar6 + 1;
          }
        }
        VP8LBitWriterSwap((VP8LBitWriter *)in_stack_fffffffffffffe60,
                          (VP8LBitWriter *)in_stack_fffffffffffffe58);
        WebPReportProgress((WebPPicture *)pic_00,iVar6,(int *)percent_store);
      }
      else {
        WebPEncodingSetError((WebPPicture *)in_stack_00000048,VP8_ENC_ERROR_OUT_OF_MEMORY);
      }
    }
  }
LAB_00187a79:
  WebPSafeFree((void *)0x187a86);
  WebPSafeFree((void *)0x187a93);
  VP8LFreeHistogramSet((VP8LHistogramSet *)0x187aa0);
  VP8LFreeHistogram((VP8LHistogram *)0x187aad);
  VP8LHashChainClear((VP8LHashChain *)0x187aba);
  if (local_98 != (void *)0x0) {
    WebPSafeFree((void *)0x187ad6);
    WebPSafeFree((void *)0x187ae3);
  }
  WebPSafeFree((void *)0x187af0);
  VP8LBitWriterWipeOut((VP8LBitWriter *)0x187afd);
  return (int)(in_stack_00000048->red[0x20] == 0);
}

Assistant:

static int EncodeImageInternal(
    VP8LBitWriter* const bw, const uint32_t* const argb,
    VP8LHashChain* const hash_chain, VP8LBackwardRefs refs_array[4], int width,
    int height, int quality, int low_effort, const CrunchConfig* const config,
    int* cache_bits, int histogram_bits_in, size_t init_byte_position,
    int* const hdr_size, int* const data_size, const WebPPicture* const pic,
    int percent_range, int* const percent) {
  const uint32_t histogram_image_xysize =
      VP8LSubSampleSize(width, histogram_bits_in) *
      VP8LSubSampleSize(height, histogram_bits_in);
  int remaining_percent = percent_range;
  int percent_start = *percent;
  VP8LHistogramSet* histogram_image = NULL;
  VP8LHistogram* tmp_histo = NULL;
  uint32_t i, histogram_image_size = 0;
  size_t bit_array_size = 0;
  HuffmanTree* const huff_tree = (HuffmanTree*)WebPSafeMalloc(
      3ULL * CODE_LENGTH_CODES, sizeof(*huff_tree));
  HuffmanTreeToken* tokens = NULL;
  HuffmanTreeCode* huffman_codes = NULL;
  uint32_t* const histogram_argb = (uint32_t*)WebPSafeMalloc(
      histogram_image_xysize, sizeof(*histogram_argb));
  int sub_configs_idx;
  int cache_bits_init, write_histogram_image;
  VP8LBitWriter bw_init = *bw, bw_best;
  int hdr_size_tmp;
  VP8LHashChain hash_chain_histogram;  // histogram image hash chain
  size_t bw_size_best = ~(size_t)0;
  assert(histogram_bits_in >= MIN_HUFFMAN_BITS);
  assert(histogram_bits_in <= MAX_HUFFMAN_BITS);
  assert(hdr_size != NULL);
  assert(data_size != NULL);

  memset(&hash_chain_histogram, 0, sizeof(hash_chain_histogram));
  if (!VP8LBitWriterInit(&bw_best, 0)) {
    WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  // Make sure we can allocate the different objects.
  if (huff_tree == NULL || histogram_argb == NULL ||
      !VP8LHashChainInit(&hash_chain_histogram, histogram_image_xysize)) {
    WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  percent_range = remaining_percent / 5;
  if (!VP8LHashChainFill(hash_chain, quality, argb, width, height,
                         low_effort, pic, percent_range, percent)) {
    goto Error;
  }
  percent_start += percent_range;
  remaining_percent -= percent_range;

  // If the value is different from zero, it has been set during the palette
  // analysis.
  cache_bits_init = (*cache_bits == 0) ? MAX_COLOR_CACHE_BITS : *cache_bits;
  // If several iterations will happen, clone into bw_best.
  if ((config->sub_configs_size > 1 || config->sub_configs[0].do_no_cache) &&
      !VP8LBitWriterClone(bw, &bw_best)) {
    WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  for (sub_configs_idx = 0; sub_configs_idx < config->sub_configs_size;
       ++sub_configs_idx) {
    const CrunchSubConfig* const sub_config =
        &config->sub_configs[sub_configs_idx];
    int cache_bits_best, i_cache;
    int i_remaining_percent = remaining_percent / config->sub_configs_size;
    int i_percent_range = i_remaining_percent / 4;
    i_remaining_percent -= i_percent_range;

    if (!VP8LGetBackwardReferences(
            width, height, argb, quality, low_effort, sub_config->lz77,
            cache_bits_init, sub_config->do_no_cache, hash_chain,
            &refs_array[0], &cache_bits_best, pic, i_percent_range, percent)) {
      goto Error;
    }

    for (i_cache = 0; i_cache < (sub_config->do_no_cache ? 2 : 1); ++i_cache) {
      const int cache_bits_tmp = (i_cache == 0) ? cache_bits_best : 0;
      int histogram_bits = histogram_bits_in;
      // Speed-up: no need to study the no-cache case if it was already studied
      // in i_cache == 0.
      if (i_cache == 1 && cache_bits_best == 0) break;

      // Reset the bit writer for this iteration.
      VP8LBitWriterReset(&bw_init, bw);

      // Build histogram image and symbols from backward references.
      histogram_image =
          VP8LAllocateHistogramSet(histogram_image_xysize, cache_bits_tmp);
      tmp_histo = VP8LAllocateHistogram(cache_bits_tmp);
      if (histogram_image == NULL || tmp_histo == NULL) {
        WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
        goto Error;
      }

      i_percent_range = i_remaining_percent / 3;
      i_remaining_percent -= i_percent_range;
      if (!VP8LGetHistoImageSymbols(
              width, height, &refs_array[i_cache], quality, low_effort,
              histogram_bits, cache_bits_tmp, histogram_image, tmp_histo,
              histogram_argb, pic, i_percent_range, percent)) {
        goto Error;
      }
      // Create Huffman bit lengths and codes for each histogram image.
      histogram_image_size = histogram_image->size;
      bit_array_size = 5 * histogram_image_size;
      huffman_codes = (HuffmanTreeCode*)WebPSafeCalloc(bit_array_size,
                                                       sizeof(*huffman_codes));
      // Note: some histogram_image entries may point to tmp_histos[], so the
      // latter need to outlive the following call to
      // GetHuffBitLengthsAndCodes().
      if (huffman_codes == NULL ||
          !GetHuffBitLengthsAndCodes(histogram_image, huffman_codes)) {
        WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
        goto Error;
      }
      // Free combined histograms.
      VP8LFreeHistogramSet(histogram_image);
      histogram_image = NULL;

      // Free scratch histograms.
      VP8LFreeHistogram(tmp_histo);
      tmp_histo = NULL;

      // Color Cache parameters.
      if (cache_bits_tmp > 0) {
        VP8LPutBits(bw, 1, 1);
        VP8LPutBits(bw, cache_bits_tmp, 4);
      } else {
        VP8LPutBits(bw, 0, 1);
      }

      // Huffman image + meta huffman.
      histogram_image_size = 0;
      for (i = 0; i < histogram_image_xysize; ++i) {
        if (histogram_argb[i] >= histogram_image_size) {
          histogram_image_size = histogram_argb[i] + 1;
        }
        histogram_argb[i] <<= 8;
      }

      write_histogram_image = (histogram_image_size > 1);
      VP8LPutBits(bw, write_histogram_image, 1);
      if (write_histogram_image) {
        VP8LOptimizeSampling(histogram_argb, width, height, histogram_bits_in,
                             MAX_HUFFMAN_BITS, &histogram_bits);
        VP8LPutBits(bw, histogram_bits - 2, 3);
        i_percent_range = i_remaining_percent / 2;
        i_remaining_percent -= i_percent_range;
        if (!EncodeImageNoHuffman(
                bw, histogram_argb, &hash_chain_histogram, &refs_array[2],
                VP8LSubSampleSize(width, histogram_bits),
                VP8LSubSampleSize(height, histogram_bits), quality, low_effort,
                pic, i_percent_range, percent)) {
          goto Error;
        }
      }

      // Store Huffman codes.
      {
        int max_tokens = 0;
        // Find maximum number of symbols for the huffman tree-set.
        for (i = 0; i < 5 * histogram_image_size; ++i) {
          HuffmanTreeCode* const codes = &huffman_codes[i];
          if (max_tokens < codes->num_symbols) {
            max_tokens = codes->num_symbols;
          }
        }
        tokens = (HuffmanTreeToken*)WebPSafeMalloc(max_tokens, sizeof(*tokens));
        if (tokens == NULL) {
          WebPEncodingSetError(pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
          goto Error;
        }
        for (i = 0; i < 5 * histogram_image_size; ++i) {
          HuffmanTreeCode* const codes = &huffman_codes[i];
          StoreHuffmanCode(bw, huff_tree, tokens, codes);
          ClearHuffmanTreeIfOnlyOneSymbol(codes);
        }
      }
      // Store actual literals.
      hdr_size_tmp = (int)(VP8LBitWriterNumBytes(bw) - init_byte_position);
      if (!StoreImageToBitMask(bw, width, histogram_bits, &refs_array[i_cache],
                               histogram_argb, huffman_codes, pic)) {
        goto Error;
      }
      // Keep track of the smallest image so far.
      if (VP8LBitWriterNumBytes(bw) < bw_size_best) {
        bw_size_best = VP8LBitWriterNumBytes(bw);
        *cache_bits = cache_bits_tmp;
        *hdr_size = hdr_size_tmp;
        *data_size =
            (int)(VP8LBitWriterNumBytes(bw) - init_byte_position - *hdr_size);
        VP8LBitWriterSwap(bw, &bw_best);
      }
      WebPSafeFree(tokens);
      tokens = NULL;
      if (huffman_codes != NULL) {
        WebPSafeFree(huffman_codes->codes);
        WebPSafeFree(huffman_codes);
        huffman_codes = NULL;
      }
    }
  }
  VP8LBitWriterSwap(bw, &bw_best);

  if (!WebPReportProgress(pic, percent_start + remaining_percent, percent)) {
    goto Error;
  }

 Error:
  WebPSafeFree(tokens);
  WebPSafeFree(huff_tree);
  VP8LFreeHistogramSet(histogram_image);
  VP8LFreeHistogram(tmp_histo);
  VP8LHashChainClear(&hash_chain_histogram);
  if (huffman_codes != NULL) {
    WebPSafeFree(huffman_codes->codes);
    WebPSafeFree(huffman_codes);
  }
  WebPSafeFree(histogram_argb);
  VP8LBitWriterWipeOut(&bw_best);
  return (pic->error_code == VP8_ENC_OK);
}